

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

bool cmGlobalGenerator::IsReservedTarget(string *name)

{
  bool bVar1;
  long lVar2;
  undefined8 *puVar3;
  char **ppcVar4;
  char *reservedTargets [10];
  
  puVar3 = &DAT_007a5430;
  ppcVar4 = reservedTargets;
  for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *ppcVar4 = (char *)*puVar3;
    puVar3 = puVar3 + 1;
    ppcVar4 = ppcVar4 + 1;
  }
  bVar1 = ::cm::
          contains<const_char_*[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&reservedTargets,name);
  return bVar1;
}

Assistant:

bool cmGlobalGenerator::IsReservedTarget(std::string const& name)
{
  // The following is a list of targets reserved
  // by one or more of the cmake generators.

  // Adding additional targets to this list will require a policy!
  const char* reservedTargets[] = { "all",       "ALL_BUILD",  "help",
                                    "install",   "INSTALL",    "preinstall",
                                    "clean",     "edit_cache", "rebuild_cache",
                                    "ZERO_CHECK" };

  return cm::contains(reservedTargets, name);
}